

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer.cpp
# Opt level: O1

void __thiscall Fossilize::ExternalReplayer::ExternalReplayer(ExternalReplayer *this)

{
  Impl *pIVar1;
  
  pIVar1 = (Impl *)operator_new(0x158);
  pIVar1->pid = -1;
  pIVar1->fd = -1;
  pIVar1->kill_fd = -1;
  pIVar1->control_fd = -1;
  pIVar1->child_fd = -1;
  pIVar1->shm_block = (SharedControlBlock *)0x0;
  pIVar1->shm_block_size = 0;
  *(undefined8 *)((long)&pIVar1->shm_block_size + 5) = 0;
  (pIVar1->faulty_spirv_modules)._M_h._M_buckets =
       &(pIVar1->faulty_spirv_modules)._M_h._M_single_bucket;
  (pIVar1->faulty_spirv_modules)._M_h._M_bucket_count = 1;
  (pIVar1->faulty_spirv_modules)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (pIVar1->faulty_spirv_modules)._M_h._M_element_count = 0;
  (pIVar1->faulty_spirv_modules)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pIVar1->faulty_spirv_modules)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (pIVar1->faulty_graphics_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->faulty_graphics_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(pIVar1->faulty_graphics_pipelines).
    super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (pIVar1->faulty_compute_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->faulty_compute_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->faulty_raytracing_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar1->faulty_raytracing_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar1->faulty_raytracing_pipelines).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar1->graphics_failed_validation)._M_h._M_buckets =
       &(pIVar1->graphics_failed_validation)._M_h._M_single_bucket;
  (pIVar1->graphics_failed_validation)._M_h._M_bucket_count = 1;
  (pIVar1->graphics_failed_validation)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (pIVar1->graphics_failed_validation)._M_h._M_element_count = 0;
  (pIVar1->graphics_failed_validation)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pIVar1->graphics_failed_validation)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (pIVar1->compute_failed_validation)._M_h._M_buckets =
       &(pIVar1->compute_failed_validation)._M_h._M_single_bucket;
  (pIVar1->compute_failed_validation)._M_h._M_bucket_count = 1;
  (pIVar1->compute_failed_validation)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (pIVar1->compute_failed_validation)._M_h._M_element_count = 0;
  (pIVar1->compute_failed_validation)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pIVar1->compute_failed_validation)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  (pIVar1->raytracing_failed_validation)._M_h._M_buckets =
       &(pIVar1->raytracing_failed_validation)._M_h._M_single_bucket;
  (pIVar1->raytracing_failed_validation)._M_h._M_bucket_count = 1;
  (pIVar1->raytracing_failed_validation)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (pIVar1->raytracing_failed_validation)._M_h._M_element_count = 0;
  (pIVar1->raytracing_failed_validation)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(pIVar1->raytracing_failed_validation)._M_h._M_rehash_policy._M_next_resize
       = (undefined1  [16])0x0;
  this->impl = pIVar1;
  return;
}

Assistant:

ExternalReplayer::ExternalReplayer()
{
	impl = new Impl;
}